

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int mbedtls_x509_crt_parse_der_internal
              (mbedtls_x509_crt *chain,uchar *buf,size_t buflen,int make_copy,
              mbedtls_x509_crt_ext_cb_t cb,void *p_ctx)

{
  mbedtls_x509_crt *pmVar1;
  bool bVar2;
  mbedtls_x509_crt *local_58;
  mbedtls_x509_crt *prev;
  mbedtls_x509_crt *crt;
  int ret;
  void *p_ctx_local;
  mbedtls_x509_crt_ext_cb_t cb_local;
  int make_copy_local;
  size_t buflen_local;
  uchar *buf_local;
  mbedtls_x509_crt *chain_local;
  
  local_58 = (mbedtls_x509_crt *)0x0;
  if ((chain == (mbedtls_x509_crt *)0x0) || (prev = chain, buf == (uchar *)0x0)) {
    chain_local._4_4_ = -0x2800;
  }
  else {
    while( true ) {
      bVar2 = false;
      if (prev->version != 0) {
        bVar2 = prev->next != (mbedtls_x509_crt *)0x0;
      }
      if (!bVar2) break;
      local_58 = prev;
      prev = prev->next;
    }
    if ((prev->version != 0) && (prev->next == (mbedtls_x509_crt *)0x0)) {
      pmVar1 = (mbedtls_x509_crt *)calloc(1,0x2f0);
      prev->next = pmVar1;
      if (prev->next == (mbedtls_x509_crt *)0x0) {
        return -0x2880;
      }
      local_58 = prev;
      mbedtls_x509_crt_init(prev->next);
      prev = prev->next;
    }
    chain_local._4_4_ = x509_crt_parse_der_core(prev,buf,buflen,make_copy,cb,p_ctx);
    if (chain_local._4_4_ == 0) {
      chain_local._4_4_ = 0;
    }
    else {
      if (local_58 != (mbedtls_x509_crt *)0x0) {
        local_58->next = (mbedtls_x509_crt *)0x0;
      }
      if (prev != chain) {
        free(prev);
      }
    }
  }
  return chain_local._4_4_;
}

Assistant:

static int mbedtls_x509_crt_parse_der_internal(mbedtls_x509_crt *chain,
                                               const unsigned char *buf,
                                               size_t buflen,
                                               int make_copy,
                                               mbedtls_x509_crt_ext_cb_t cb,
                                               void *p_ctx)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_x509_crt *crt = chain, *prev = NULL;

    /*
     * Check for valid input
     */
    if (crt == NULL || buf == NULL) {
        return MBEDTLS_ERR_X509_BAD_INPUT_DATA;
    }

    while (crt->version != 0 && crt->next != NULL) {
        prev = crt;
        crt = crt->next;
    }

    /*
     * Add new certificate on the end of the chain if needed.
     */
    if (crt->version != 0 && crt->next == NULL) {
        crt->next = mbedtls_calloc(1, sizeof(mbedtls_x509_crt));

        if (crt->next == NULL) {
            return MBEDTLS_ERR_X509_ALLOC_FAILED;
        }

        prev = crt;
        mbedtls_x509_crt_init(crt->next);
        crt = crt->next;
    }

    ret = x509_crt_parse_der_core(crt, buf, buflen, make_copy, cb, p_ctx);
    if (ret != 0) {
        if (prev) {
            prev->next = NULL;
        }

        if (crt != chain) {
            mbedtls_free(crt);
        }

        return ret;
    }

    return 0;
}